

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_out_tlb_load(TCGContext_conflict9 *s,TCGReg addrlo,TCGReg addrhi,int mem_index,MemOp opc,
                     tcg_insn_unit **label_ptr,int which)

{
  uint *puVar1;
  tcg_insn_unit tVar2;
  ulong uVar3;
  tcg_insn_unit *ptVar4;
  TCGReg TVar5;
  int *piVar6;
  undefined4 in_register_00000084;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  bool bVar11;
  
  uVar9 = mem_index & 0x70;
  uVar7 = (uint)label_ptr;
  if (uVar9 != 0) {
    if (uVar9 == 0x70) {
      uVar9 = mem_index & 3;
    }
    else {
      uVar9 = uVar9 >> 4;
    }
  }
  uVar8 = -1 << ((byte)uVar9 & 0x1f);
  tcg_out_mov(s,TCG_TYPE_I32,TCG_REG_EDI,addrlo);
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = 0xc1;
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = 0xef;
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = '\b';
  iVar10 = addrhi * 0x10 + -0x40;
  uVar3 = (ulong)iVar10;
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = '#';
  ptVar4 = s->code_ptr;
  bVar11 = (long)(char)(tcg_insn_unit)iVar10 != uVar3;
  tVar2 = 0xbd;
  if (!bVar11) {
    tVar2 = '}';
  }
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = tVar2;
  if (bVar11) {
    piVar6 = (int *)s->code_ptr;
    *piVar6 = iVar10;
    piVar6 = piVar6 + 1;
  }
  else {
    ptVar4 = s->code_ptr;
    s->code_ptr = ptVar4 + 1;
    *ptVar4 = (tcg_insn_unit)iVar10;
    piVar6 = (int *)s->code_ptr;
  }
  s->code_ptr = (tcg_insn_unit *)((long)piVar6 + 1);
  *(tcg_insn_unit *)piVar6 = 'H';
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = '\x03';
  tVar2 = 0xbd;
  if (uVar3 + 0x88 < 0x100) {
    tVar2 = '}';
  }
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = tVar2;
  ptVar4 = s->code_ptr;
  if (uVar3 + 0x88 < 0x100) {
    s->code_ptr = ptVar4 + 1;
    *ptVar4 = (tcg_insn_unit)(uVar3 | 8);
  }
  else {
    *(int *)ptVar4 = (int)(uVar3 | 8);
    s->code_ptr = ptVar4 + 4;
  }
  if (uVar9 < (mem_index & 3U)) {
    TVar5 = TCG_REG_EAX;
    if (0 < (int)addrlo) {
      TVar5 = addrlo;
    }
    ptVar4 = s->code_ptr;
    if ((TVar5 & TCG_REG_R8) != TCG_REG_EAX) {
      s->code_ptr = ptVar4 + 1;
      *ptVar4 = 'A';
      ptVar4 = s->code_ptr;
    }
    s->code_ptr = ptVar4 + 1;
    *ptVar4 = 0x8d;
    tcg_out_sib_offset(s,6,addrlo,-1,0,(ulong)(uVar8 + (1 << (sbyte)(mem_index & 3U))));
  }
  else {
    tcg_out_mov(s,TCG_TYPE_I32,TCG_REG_ESI,addrlo);
  }
  tgen_arithi(s,4,6,(ulong)(~uVar8 | 0xffffc000),0);
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = ';';
  if (uVar7 == 0) {
    ptVar4 = s->code_ptr;
    s->code_ptr = ptVar4 + 1;
    *ptVar4 = '7';
  }
  else {
    tVar2 = 0xb7;
    if (uVar7 < 0x80) {
      tVar2 = 'w';
    }
    ptVar4 = s->code_ptr;
    s->code_ptr = ptVar4 + 1;
    *ptVar4 = tVar2;
    if (uVar7 < 0x80) {
      ptVar4 = s->code_ptr;
      s->code_ptr = ptVar4 + 1;
      *ptVar4 = (tcg_insn_unit)label_ptr;
    }
    else {
      puVar1 = (uint *)s->code_ptr;
      *puVar1 = uVar7;
      s->code_ptr = (tcg_insn_unit *)(puVar1 + 1);
    }
  }
  tcg_out_mov(s,TCG_TYPE_I32,TCG_REG_ESI,addrlo);
  tVar2 = 0xe9;
  if ((s->uc->hook[10].head == (list_item *)0x0) && (s->uc->hook[0xb].head == (list_item *)0x0)) {
    ptVar4 = s->code_ptr;
    s->code_ptr = ptVar4 + 1;
    *ptVar4 = '\x0f';
    tVar2 = 0x85;
  }
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = tVar2;
  ptVar4 = s->code_ptr;
  *(tcg_insn_unit **)CONCAT44(in_register_00000084,opc) = ptVar4;
  s->code_ptr = ptVar4 + 5;
  ptVar4[4] = 'H';
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = '\x03';
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = 'w';
  ptVar4 = s->code_ptr;
  s->code_ptr = ptVar4 + 1;
  *ptVar4 = '\x10';
  return;
}

Assistant:

static inline void tcg_out_tlb_load(TCGContext *s, TCGReg addrlo, TCGReg addrhi,
                                    int mem_index, MemOp opc,
                                    tcg_insn_unit **label_ptr, int which)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = s->uc;
#endif
    const TCGReg r0 = TCG_REG_L0;
    const TCGReg r1 = TCG_REG_L1;
    TCGType ttype = TCG_TYPE_I32;
    TCGType tlbtype = TCG_TYPE_I32;
    int trexw = 0, hrexw = 0, tlbrexw = 0;
    unsigned a_bits = get_alignment_bits(opc);
    unsigned s_bits = opc & MO_SIZE;
    unsigned a_mask = (1 << a_bits) - 1;
    unsigned s_mask = (1 << s_bits) - 1;
    target_ulong tlb_mask;

    if (TCG_TARGET_REG_BITS == 64) {
        if (TARGET_LONG_BITS == 64) {
            ttype = TCG_TYPE_I64;
            trexw = P_REXW;
        }
        if (TCG_TYPE_PTR == TCG_TYPE_I64) {
            hrexw = P_REXW;
            if (TARGET_PAGE_BITS + CPU_TLB_DYN_MAX_BITS > 32) {
                tlbtype = TCG_TYPE_I64;
                tlbrexw = P_REXW;
            }
        }
    }

    tcg_out_mov(s, tlbtype, r0, addrlo);
    tcg_out_shifti(s, SHIFT_SHR + tlbrexw, r0,
                   TARGET_PAGE_BITS - CPU_TLB_ENTRY_BITS);

    tcg_out_modrm_offset(s, OPC_AND_GvEv + trexw, r0, TCG_AREG0,
                         TLB_MASK_TABLE_OFS(mem_index) +
                         offsetof(CPUTLBDescFast, mask));

    tcg_out_modrm_offset(s, OPC_ADD_GvEv + hrexw, r0, TCG_AREG0,
                         TLB_MASK_TABLE_OFS(mem_index) +
                         offsetof(CPUTLBDescFast, table));

    /* If the required alignment is at least as large as the access, simply
       copy the address and mask.  For lesser alignments, check that we don't
       cross pages for the complete access.  */
    if (a_bits >= s_bits) {
        tcg_out_mov(s, ttype, r1, addrlo);
    } else {
        tcg_out_modrm_offset(s, OPC_LEA + trexw, r1, addrlo, s_mask - a_mask);
    }
    tlb_mask = (target_ulong)TARGET_PAGE_MASK | a_mask;
    tgen_arithi(s, ARITH_AND + trexw, r1, tlb_mask, 0);

    /* cmp 0(r0), r1 */
    tcg_out_modrm_offset(s, OPC_CMP_GvEv + trexw, r1, r0, which);

    /* Prepare for both the fast path add of the tlb addend, and the slow
       path function argument setup.  */
    tcg_out_mov(s, ttype, r1, addrlo);

    // Unicorn: fast path if hookmem is not enable
    if (!HOOK_EXISTS(s->uc, UC_HOOK_MEM_READ) && !HOOK_EXISTS(s->uc, UC_HOOK_MEM_WRITE))
        tcg_out_opc(s, OPC_JCC_long + JCC_JNE, 0, 0, 0);
    else
        /* slow_path, so data access will go via load_helper() */
        tcg_out_opc(s, OPC_JMP_long, 0, 0, 0);

    label_ptr[0] = s->code_ptr;
    s->code_ptr += 4;

    if (TARGET_LONG_BITS > TCG_TARGET_REG_BITS) {
        /* cmp 4(r0), addrhi */
        tcg_out_modrm_offset(s, OPC_CMP_GvEv, addrhi, r0, which + 4);

        /* jne slow_path */
        tcg_out_opc(s, OPC_JCC_long + JCC_JNE, 0, 0, 0);
        label_ptr[1] = s->code_ptr;
        s->code_ptr += 4;
    }

    /* TLB Hit.  */

    /* add addend(r0), r1 */
    tcg_out_modrm_offset(s, OPC_ADD_GvEv + hrexw, r1, r0,
                         offsetof(CPUTLBEntry, addend));
}